

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O3

int Dau_CountSymms(word t,int nVars)

{
  int i;
  int iVar1;
  int iVar2;
  int iVar3;
  int j;
  word Cof1;
  word Cof0;
  word local_48;
  word local_40;
  word local_38;
  
  if (nVars < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    i = 0;
    local_48 = t;
    do {
      iVar3 = i + 1;
      j = iVar3;
      if (iVar3 < nVars) {
        do {
          iVar1 = Abc_TtVarsAreSymmetric(&local_48,nVars,i,j,&local_38,&local_40);
          iVar2 = iVar2 + iVar1;
          j = j + 1;
        } while (nVars != j);
      }
      i = iVar3;
    } while (iVar3 != nVars);
  }
  return iVar2;
}

Assistant:

int Dau_CountSymms( word t, int nVars )
{
    word Cof0, Cof1;
    int i, j, nPairs = 0;
    for ( i = 0; i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
        nPairs += Abc_TtVarsAreSymmetric(&t, nVars, i, j, &Cof0, &Cof1);
    return nPairs;
}